

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_Vk.cpp
# Opt level: O0

void Diligent::SerializationDeviceImpl::GetPipelineResourceBindingsVk
               (PipelineResourceBindingAttribs *Info,
               vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
               *ResourceBindings)

{
  DESCRIPTOR_SET_ID SetId_00;
  uint uVar1;
  Uint32 UVar2;
  SHADER_TYPE SVar3;
  PipelineResourceSignatureVkImpl *pPVar4;
  const_iterator pDVar5;
  Char *pCVar6;
  char (*Args_1) [50];
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *local_150;
  SHADER_TYPE local_144;
  undefined1 local_140 [8];
  string msg_1;
  string msg;
  DESCRIPTOR_SET_ID SetId;
  const_iterator __end2;
  const_iterator __begin2;
  undefined8 local_e0;
  initializer_list<Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID> local_d8;
  initializer_list<Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID> *local_c8;
  initializer_list<Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID> *__range2;
  PipelineResourceAttribsType *local_a0;
  PipelineResourceAttribsType *ResAttr;
  PipelineResourceDesc *ResDesc;
  RefCntAutoPtr *pRStack_88;
  Uint32 r;
  value_type *pSignature;
  uint local_78;
  Uint32 sign;
  Uint32 DescSetLayoutCount;
  uint local_64;
  undefined1 local_60 [4];
  Uint32 SignaturesCount;
  SignatureArray<PipelineResourceSignatureVkImpl> Signatures;
  SHADER_TYPE ShaderStages;
  vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
  *ResourceBindings_local;
  PipelineResourceBindingAttribs *Info_local;
  
  if (Info->ShaderStages == SHADER_TYPE_UNKNOWN) {
    local_144 = ~SHADER_TYPE_UNKNOWN;
  }
  else {
    local_144 = Info->ShaderStages;
  }
  Signatures._M_elems[7].m_pObject._4_4_ = local_144;
  memset(local_60,0,0x40);
  local_150 = (RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)local_60;
  do {
    RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::RefCntAutoPtr(local_150);
    local_150 = local_150 + 1;
  } while (local_150 != Signatures._M_elems + 7);
  local_64 = 0;
  Args_1 = (char (*) [50])&local_64;
  anon_unknown_60::SortResourceSignatures<Diligent::PipelineResourceSignatureVkImpl>
            (Info->ppResourceSignatures,Info->ResourceSignaturesCount,
             (SignatureArray<Diligent::PipelineResourceSignatureVkImpl> *)local_60,(Uint32 *)Args_1)
  ;
  local_78 = 0;
  for (pSignature._4_4_ = 0; pSignature._4_4_ < local_64; pSignature._4_4_ = pSignature._4_4_ + 1) {
    pRStack_88 = (RefCntAutoPtr *)
                 std::array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>,_8UL>
                 ::operator[]((array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>,_8UL>
                               *)local_60,(ulong)pSignature._4_4_);
    pPVar4 = Diligent::RefCntAutoPtr::operator_cast_to_PipelineResourceSignatureVkImpl_(pRStack_88);
    if (pPVar4 != (PipelineResourceSignatureVkImpl *)0x0) {
      ResDesc._4_4_ = 0;
      while( true ) {
        uVar1 = ResDesc._4_4_;
        pPVar4 = RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator->
                           ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)pRStack_88);
        UVar2 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetTotalResourceCount
                          (&pPVar4->
                            super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>);
        Args_1 = (char (*) [50])(ulong)UVar2;
        if (UVar2 <= uVar1) break;
        pPVar4 = RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator->
                           ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)pRStack_88);
        ResAttr = (PipelineResourceAttribsType *)
                  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                            (&pPVar4->
                              super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                             ResDesc._4_4_);
        pPVar4 = RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator->
                           ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)pRStack_88);
        local_a0 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                             (&pPVar4->
                               super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                              ResDesc._4_4_);
        SVar3 = Diligent::operator&(ResAttr->SRBCacheOffset,Signatures._M_elems[7].m_pObject._4_4_);
        if (SVar3 != SHADER_TYPE_UNKNOWN) {
          ResDescToPipelineResBinding
                    ((PipelineResourceBinding *)&__range2,(PipelineResourceDesc *)ResAttr,
                     ResAttr->SRBCacheOffset,(uint)*(ulong *)local_a0 & 0xffff,
                     local_78 + ((*(ulong *)local_a0 >> 0x3e & 1) != 0));
          std::
          vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
          ::push_back(ResourceBindings,(value_type *)&__range2);
        }
        ResDesc._4_4_ = ResDesc._4_4_ + 1;
      }
      __begin2 = (const_iterator)0x0;
      local_e0 = 1;
      local_d8._M_array = (iterator)&__begin2;
      local_d8._M_len = 2;
      local_c8 = &local_d8;
      __end2 = std::initializer_list<Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID>::
               begin(local_c8);
      pDVar5 = std::initializer_list<Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID>::
               end(local_c8);
      for (; __end2 != pDVar5; __end2 = __end2 + 1) {
        SetId_00 = *__end2;
        pPVar4 = RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator->
                           ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)pRStack_88);
        UVar2 = PipelineResourceSignatureVkImpl::GetDescriptorSetSize(pPVar4,SetId_00);
        if (UVar2 != 0xffffffff) {
          local_78 = local_78 + 1;
        }
      }
    }
  }
  if (0x10 < local_78) {
    FormatString<char[26],char[50]>
              ((string *)((long)&msg_1.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2",Args_1);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"GetPipelineResourceBindingsVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Vk.cpp"
               ,0x106);
    std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
  }
  if (local_78 < Info->ResourceSignaturesCount) {
    FormatString<char[26],char[51]>
              ((string *)local_140,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"DescSetLayoutCount >= Info.ResourceSignaturesCount",
               (char (*) [51])Info);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"GetPipelineResourceBindingsVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Vk.cpp"
               ,0x107);
    std::__cxx11::string::~string((string *)local_140);
  }
  std::array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>,_8UL>::~array
            ((array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>,_8UL> *)
             local_60);
  return;
}

Assistant:

void SerializationDeviceImpl::GetPipelineResourceBindingsVk(const PipelineResourceBindingAttribs& Info,
                                                            std::vector<PipelineResourceBinding>& ResourceBindings)
{
    const auto ShaderStages = (Info.ShaderStages == SHADER_TYPE_UNKNOWN ? static_cast<SHADER_TYPE>(~0u) : Info.ShaderStages);

    SignatureArray<PipelineResourceSignatureVkImpl> Signatures      = {};
    Uint32                                          SignaturesCount = 0;
    SortResourceSignatures(Info.ppResourceSignatures, Info.ResourceSignaturesCount, Signatures, SignaturesCount);

    Uint32 DescSetLayoutCount = 0;
    for (Uint32 sign = 0; sign < SignaturesCount; ++sign)
    {
        const auto& pSignature = Signatures[sign];
        if (pSignature == nullptr)
            continue;

        for (Uint32 r = 0; r < pSignature->GetTotalResourceCount(); ++r)
        {
            const auto& ResDesc = pSignature->GetResourceDesc(r);
            const auto& ResAttr = pSignature->GetResourceAttribs(r);
            if ((ResDesc.ShaderStages & ShaderStages) == 0)
                continue;

            ResourceBindings.push_back(ResDescToPipelineResBinding(ResDesc, ResDesc.ShaderStages, ResAttr.BindingIndex, DescSetLayoutCount + ResAttr.DescrSet));
        }

        // Same as PipelineLayoutVk::Create()
        for (auto SetId : {PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE, PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC})
        {
            if (pSignature->GetDescriptorSetSize(SetId) != ~0u)
                ++DescSetLayoutCount;
        }
    }
    VERIFY_EXPR(DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2);
    VERIFY_EXPR(DescSetLayoutCount >= Info.ResourceSignaturesCount);
}